

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O3

ps_seg_t * ngram_bp_seg_next(ps_seg_t *seg)

{
  short sVar1;
  bptbl_seg_t *itor;
  
  sVar1 = *(short *)((long)&seg[1].search + 2) + 1;
  *(short *)((long)&seg[1].search + 2) = sVar1;
  if (sVar1 == *(short *)&seg[1].search) {
    ckd_free(seg[1].vt);
    ckd_free(seg);
    seg = (ps_seg_t *)0x0;
  }
  else {
    ngram_search_bp2itor(seg,*(int *)((long)&(seg[1].vt)->seg_next + (long)sVar1 * 4));
  }
  return seg;
}

Assistant:

static ps_seg_t *
ngram_bp_seg_next(ps_seg_t *seg)
{
    bptbl_seg_t *itor = (bptbl_seg_t *)seg;

    if (++itor->cur == itor->n_bpidx) {
        ngram_bp_seg_free(seg);
        return NULL;
    }

    ngram_search_bp2itor(seg, itor->bpidx[itor->cur]);
    return seg;
}